

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O0

__normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
* duckdb_apache::thrift::
  to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::SchemaElement_const*,std::vector<duckdb_parquet::SchemaElement,std::allocator<duckdb_parquet::SchemaElement>>>>
            (__normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
             *beg,__normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
                  *end)

{
  bool bVar1;
  undefined8 *in_RSI;
  __normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
  *in_RDI;
  __normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
  it;
  ostringstream o;
  __normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
  *__lhs;
  string local_1c8 [48];
  __normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
  local_198;
  ostringstream local_190 [344];
  SchemaElement *in_stack_ffffffffffffffc8;
  
  __lhs = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_198._M_current = (SchemaElement *)*in_RSI;
  while (bVar1 = __gnu_cxx::operator!=(__lhs,in_RDI), bVar1) {
    bVar1 = __gnu_cxx::operator!=(__lhs,in_RDI);
    if (bVar1) {
      std::operator<<((ostream *)local_190,", ");
    }
    __gnu_cxx::
    __normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
    ::operator*(&local_198);
    to_string<duckdb_parquet::SchemaElement>(in_stack_ffffffffffffffc8);
    std::operator<<((ostream *)local_190,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    __gnu_cxx::
    __normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
    ::operator++(&local_198);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __lhs;
}

Assistant:

std::string to_string(const T& beg, const T& end) {
  std::ostringstream o;
  for (T it = beg; it != end; ++it) {
    if (it != beg)
      o << ", ";
    o << to_string(*it);
  }
  return o.str();
}